

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_fseek(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long *plVar1;
  undefined8 *puVar2;
  jx9_real jVar3;
  int iVar4;
  undefined4 uVar5;
  jx9_value *pjVar6;
  char *pcVar7;
  
  if ((((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (plVar1 = (long *)((*apArg)->x).pOther, plVar1 == (long *)0x0)) ||
     (*(int *)((long)plVar1 + 0x34) != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
  }
  else {
    puVar2 = (undefined8 *)*plVar1;
    if ((puVar2 != (undefined8 *)0x0) && (puVar2[9] != 0)) {
      pjVar6 = apArg[1];
      jx9MemObjToInteger(pjVar6);
      jVar3 = (pjVar6->x).rVal;
      uVar5 = 0;
      if ((nArg != 2) && (pjVar6 = apArg[2], (pjVar6->iFlags & 2) != 0)) {
        jx9MemObjToInteger(pjVar6);
        uVar5 = *(undefined4 *)&pjVar6->x;
      }
      iVar4 = (*(code *)puVar2[9])(plVar1[1],jVar3,uVar5);
      if (iVar4 == 0) {
        *(undefined4 *)(plVar1 + 4) = 0;
        if ((*(uint *)(plVar1 + 5) & 4) != 0) {
          plVar1[3] = 0;
          *(undefined4 *)((long)plVar1 + 0x24) = 0;
          *(uint *)(plVar1 + 5) = *(uint *)(plVar1 + 5) & 0xfffffffb;
        }
        *(undefined4 *)(plVar1 + 6) = 0;
      }
      pjVar6 = pCtx->pRet;
      jx9MemObjRelease(pjVar6);
      (pjVar6->x).iVal = -(ulong)(iVar4 != 0);
      goto LAB_0013d932;
    }
    if (puVar2 == (undefined8 *)0x0) {
      pcVar7 = "null_stream";
    }
    else {
      pcVar7 = (char *)*puVar2;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
               (pCtx->pFunc->sName).zString,pcVar7);
  }
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).iVal = -1;
LAB_0013d932:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_fseek(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 iOfft;
	int whence;  
	int rc;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xSeek == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the offset */
	iOfft = jx9_value_to_int64(apArg[1]);
	whence = 0;/* SEEK_SET */
	if( nArg > 2 && jx9_value_is_int(apArg[2]) ){
		whence = jx9_value_to_int(apArg[2]);
	}
	/* Perform the requested operation */
	rc = pStream->xSeek(pDev->pHandle, iOfft, whence);
	if( rc == JX9_OK ){
		/* Ignore buffered data */
		ResetIOPrivate(pDev);
	}
	/* IO result */
	jx9_result_int(pCtx, rc == JX9_OK ? 0 : - 1);
	return JX9_OK;	
}